

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooleanDatatypeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::BooleanDatatypeValidator::checkContent
          (BooleanDatatypeValidator *this,XMLCh *content,ValidationContext *context,bool asBase,
          MemoryManager *manager)

{
  DatatypeValidator *pDVar1;
  ulong uVar2;
  bool bVar3;
  InvalidDatatypeValueException *this_00;
  ulong uVar4;
  
  pDVar1 = (this->super_DatatypeValidator).fBaseValidator;
  if (pDVar1 != (DatatypeValidator *)0x0) {
    (*(pDVar1->super_XSerializable)._vptr_XSerializable[0xc])(pDVar1,content,context,1,manager);
  }
  if (((this->super_DatatypeValidator).fFacetsDefined & 8) != 0) {
    bVar3 = RegularExpression::matches((this->super_DatatypeValidator).fRegex,content,manager);
    if (!bVar3) {
      this_00 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeValueException::InvalidDatatypeValueException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                 ,0x69,VALUE_NotMatch_Pattern,content,(this->super_DatatypeValidator).fPattern,
                 (XMLCh *)0x0,(XMLCh *)0x0,manager);
      goto LAB_002eb68f;
    }
  }
  if (!asBase) {
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      if (3 < uVar4) break;
      bVar3 = XMLString::equals(content,(XMLCh *)(XMLUni::fgBooleanValueSpace + uVar4 * 0x10));
      uVar2 = (ulong)((int)uVar4 + 1);
    } while (!bVar3);
    if (uVar4 == 4) {
      this_00 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeValueException::InvalidDatatypeValueException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                 ,0x7e,VALUE_Invalid_Name,content,(XMLCh *)SchemaSymbols::fgDT_BOOLEAN,(XMLCh *)0x0,
                 (XMLCh *)0x0,manager);
LAB_002eb68f:
      __cxa_throw(this_00,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
    }
  }
  return;
}

Assistant:

void BooleanDatatypeValidator::checkContent( const XMLCh*             const content
                                           ,       ValidationContext* const context
                                           ,       bool                     asBase
                                           ,       MemoryManager*     const manager)
{

    //validate against base validator if any
    BooleanDatatypeValidator *pBaseValidator = (BooleanDatatypeValidator*) this->getBaseValidator();
    if (pBaseValidator !=0)
        pBaseValidator->checkContent(content, context, true, manager);

    // we check pattern first
    if ( (getFacetsDefined() & DatatypeValidator::FACET_PATTERN ) != 0 )
    {
        if (getRegex()->matches(content, manager) ==false)
        {
            ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_NotMatch_Pattern
                    , content
                    , getPattern()
                    , manager);
        }
    }

    // if this is a base validator, we only need to check pattern facet
    // all other facet were inherited by the derived type
    if (asBase)
        return;

    unsigned int   i = 0;
    for ( ; i < XMLUni::fgBooleanValueSpaceArraySize; i++ )
    {
        if ( XMLString::equals(content, XMLUni::fgBooleanValueSpace[i]))
            break;
    }

    if (i == XMLUni::fgBooleanValueSpaceArraySize)
        ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                           , XMLExcepts::VALUE_Invalid_Name
                           , content
                           , SchemaSymbols::fgDT_BOOLEAN
                           , manager);
        //Not valid boolean type

}